

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_tonumber(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  lua_Integer lVar3;
  lua_Integer base;
  lua_Integer n;
  char *s_1;
  size_t l_1;
  char *s;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  iVar1 = lua_type(L,2);
  if (iVar1 < 1) {
    iVar1 = lua_type((lua_State *)l,1);
    if (iVar1 == 3) {
      lua_settop((lua_State *)l,1);
      return 1;
    }
    l_1 = (size_t)lua_tolstring((lua_State *)l,1,(size_t *)&s);
    if (((char *)l_1 != (char *)0x0) &&
       (pcVar2 = (char *)lua_stringtonumber((lua_State *)l,(char *)l_1), pcVar2 == s + 1)) {
      return 1;
    }
    luaL_checkany((lua_State *)l,1);
  }
  else {
    base = 0;
    lVar3 = luaL_checkinteger((lua_State *)l,2);
    luaL_checktype((lua_State *)l,1,4);
    n = (lua_Integer)lua_tolstring((lua_State *)l,1,(size_t *)&s_1);
    if (lVar3 < 2 || 0x24 < lVar3) {
      luaL_argerror((lua_State *)l,2,"base out of range");
    }
    pcVar2 = b_str2int((char *)n,(int)lVar3,&base);
    if (pcVar2 == s_1 + n) {
      lua_pushinteger((lua_State *)l,base);
      return 1;
    }
  }
  lua_pushnil((lua_State *)l);
  return 1;
}

Assistant:

static int luaB_tonumber (lua_State *L) {
  if (lua_isnoneornil(L, 2)) {  /* standard conversion? */
    if (lua_type(L, 1) == LUA_TNUMBER) {  /* already a number? */
      lua_settop(L, 1);  /* yes; return it */
      return 1;
    }
    else {
      size_t l;
      const char *s = lua_tolstring(L, 1, &l);
      if (s != NULL && lua_stringtonumber(L, s) == l + 1)
        return 1;  /* successful conversion to number */
      /* else not a number */
      luaL_checkany(L, 1);  /* (but there must be some parameter) */
    }
  }
  else {
    size_t l;
    const char *s;
    lua_Integer n = 0;  /* to avoid warnings */
    lua_Integer base = luaL_checkinteger(L, 2);
    luaL_checktype(L, 1, LUA_TSTRING);  /* no numbers as strings */
    s = lua_tolstring(L, 1, &l);
    luaL_argcheck(L, 2 <= base && base <= 36, 2, "base out of range");
    if (b_str2int(s, (int)base, &n) == s + l) {
      lua_pushinteger(L, n);
      return 1;
    }  /* else not a number */
  }  /* else not a number */
  luaL_pushfail(L);  /* not a number */
  return 1;
}